

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateFunction
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateFunctionInfo *info)

{
  bool bVar1;
  CatalogSet *this_00;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  type pAVar3;
  pointer pSVar4;
  InternalException *this_01;
  CatalogType type;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_b0;
  allocator local_a1;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_a0;
  string local_98;
  DatabaseInstance *local_78;
  ClientContext *pCStack_70;
  Transaction *local_68;
  transaction_t tStack_60;
  transaction_t local_58;
  string local_48;
  
  if ((info->super_CreateInfo).on_conflict == ALTER_ON_CONFLICT) {
    this_00 = GetCatalogSet(this,(info->super_CreateInfo).super_ParseInfo.field_0x9);
    oVar2 = CatalogSet::GetEntry(this_00,transaction,&info->name);
    if (oVar2.ptr != (CatalogEntry *)0x0) {
      (*(info->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[4])(&local_98,info);
      local_58 = transaction.start_time;
      local_68 = transaction.transaction.ptr;
      tStack_60 = transaction.transaction_id;
      local_78 = transaction.db.ptr;
      pCStack_70 = transaction.context.ptr;
      pAVar3 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::
               operator*((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                          *)&local_98);
      (*(this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [0x20])(this,pAVar3);
      if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
      }
      return (optional_ptr<duckdb::CatalogEntry,_true>)(CatalogEntry *)0x0;
    }
  }
  local_b0._M_head_impl = (StandardEntry *)0x0;
  switch((info->super_CreateInfo).super_ParseInfo.field_0x9) {
  case 0x19:
    make_uniq_base<duckdb::StandardEntry,duckdb::TableFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateTableFunctionInfo&>
              ((duckdb *)&local_98,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateTableFunctionInfo *)info);
    break;
  case 0x1a:
    make_uniq_base<duckdb::StandardEntry,duckdb::ScalarFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateScalarFunctionInfo&>
              ((duckdb *)&local_98,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateScalarFunctionInfo *)info);
    break;
  case 0x1b:
    make_uniq_base<duckdb::StandardEntry,duckdb::AggregateFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateAggregateFunctionInfo&>
              ((duckdb *)&local_98,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateAggregateFunctionInfo *)info);
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_98,"Unknown function type \"%s\"",&local_a1);
    CatalogTypeToString_abi_cxx11_
              (&local_48,(duckdb *)(ulong)(byte)(info->super_CreateInfo).super_ParseInfo.field_0x9,
               type);
    InternalException::InternalException<std::__cxx11::string>(this_01,&local_98,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x1e:
    make_uniq_base<duckdb::StandardEntry,duckdb::ScalarMacroCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateMacroInfo&>
              ((duckdb *)&local_98,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateMacroInfo *)info);
    break;
  case 0x1f:
    make_uniq_base<duckdb::StandardEntry,duckdb::TableMacroCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateMacroInfo&>
              ((duckdb *)&local_98,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateMacroInfo *)info);
  }
  local_b0._M_head_impl = (StandardEntry *)local_98._M_dataplus._M_p;
  bVar1 = (info->super_CreateInfo).internal;
  pSVar4 = unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>::
           operator->((unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                       *)&local_b0);
  (pSVar4->super_InCatalogEntry).super_CatalogEntry.internal = bVar1;
  local_a0._M_head_impl = (AlterInfo *)local_b0._M_head_impl;
  local_b0._M_head_impl = (StandardEntry *)0x0;
  oVar2 = AddEntry(this,transaction,
                   (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                    *)&local_a0,(info->super_CreateInfo).on_conflict);
  if ((StandardEntry *)local_a0._M_head_impl != (StandardEntry *)0x0) {
    (*(((InCatalogEntry *)&(local_a0._M_head_impl)->super_ParseInfo)->super_CatalogEntry).
      _vptr_CatalogEntry[1])();
  }
  local_a0._M_head_impl = (AlterInfo *)0x0;
  if (local_b0._M_head_impl != (StandardEntry *)0x0) {
    (*((local_b0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateFunction(CatalogTransaction transaction, CreateFunctionInfo &info) {
	if (info.on_conflict == OnCreateConflict::ALTER_ON_CONFLICT) {
		// check if the original entry exists
		auto &catalog_set = GetCatalogSet(info.type);
		auto current_entry = catalog_set.GetEntry(transaction, info.name);
		if (current_entry) {
			// the current entry exists - alter it instead
			auto alter_info = info.GetAlterInfo();
			Alter(transaction, *alter_info);
			return nullptr;
		}
	}
	unique_ptr<StandardEntry> function;
	switch (info.type) {
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		function = make_uniq_base<StandardEntry, ScalarFunctionCatalogEntry>(catalog, *this,
		                                                                     info.Cast<CreateScalarFunctionInfo>());
		break;
	case CatalogType::TABLE_FUNCTION_ENTRY:
		function = make_uniq_base<StandardEntry, TableFunctionCatalogEntry>(catalog, *this,
		                                                                    info.Cast<CreateTableFunctionInfo>());
		break;
	case CatalogType::MACRO_ENTRY:
		// create a macro function
		function = make_uniq_base<StandardEntry, ScalarMacroCatalogEntry>(catalog, *this, info.Cast<CreateMacroInfo>());
		break;

	case CatalogType::TABLE_MACRO_ENTRY:
		// create a macro table function
		function = make_uniq_base<StandardEntry, TableMacroCatalogEntry>(catalog, *this, info.Cast<CreateMacroInfo>());
		break;
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
		D_ASSERT(info.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);
		// create an aggregate function
		function = make_uniq_base<StandardEntry, AggregateFunctionCatalogEntry>(
		    catalog, *this, info.Cast<CreateAggregateFunctionInfo>());
		break;
	default:
		throw InternalException("Unknown function type \"%s\"", CatalogTypeToString(info.type));
	}
	function->internal = info.internal;
	return AddEntry(transaction, std::move(function), info.on_conflict);
}